

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::FString(FString *this,char *head,char *tail)

{
  size_t len;
  size_t len_00;
  size_t len2;
  size_t len1;
  char *tail_local;
  char *head_local;
  FString *this_local;
  
  len = strlen(head);
  len_00 = strlen(tail);
  AllocBuffer(this,len + len_00);
  StrCopy(this->Chars,head,len);
  StrCopy(this->Chars + len,tail,len_00);
  return;
}

Assistant:

FString::FString (const char *head, const char *tail)
{
	size_t len1 = strlen (head);
	size_t len2 = strlen (tail);
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head, len1);
	StrCopy (Chars + len1, tail, len2);
}